

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

string * __thiscall
flatbuffers::swift::SwiftGenerator::GenMutateArray_abi_cxx11_
          (string *__return_storage_ptr__,SwiftGenerator *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  size_type __dnew;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  long local_28;
  
  local_28 = 0x39;
  local_48 = local_38;
  local_48 = (long *)std::__cxx11::string::_M_create((ulong *)&local_48,(ulong)&local_28);
  local_38[0] = local_28;
  *local_48 = 0x203d206f2074656c;
  local_48[1] = 0x5353454343417b7b;
  local_48[2] = 0x657366666f2e7d7d;
  local_48[3] = 0x4c4241547b7b2874;
  local_48[4] = 0x7d54455346464f45;
  local_48[5] = 0x5346464f7b7b2e7d;
  builtin_strncpy((char *)((long)local_48 + 0x29),".{{OFFSE",8);
  builtin_strncpy((char *)((long)local_48 + 0x31),"T}}.v); ",8);
  local_40 = local_28;
  *(char *)((long)local_48 + local_28) = '\0';
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x37b0a1);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenMutateArray() {
    return "{{ACCESS_TYPE}} func mutate({{FIELDVAR}}: {{VALUETYPE}}, at "
           "index: Int32) -> Bool { " +
           GenOffset() +
           "return {{ACCESS}}.directMutate({{FIELDVAR}}, index: "
           "{{ACCESS}}.vector(at: o) + index * {{SIZE}}) }";
  }